

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void __thiscall ParseInt16_Underscores_Test::TestBody(ParseInt16_Underscores_Test *this)

{
  anon_unknown.dwarf_856b6::AssertInt16Equals(0x3039,"12_345",Both);
  anon_unknown.dwarf_856b6::AssertInt16Equals(0x3039,"+12_345",SignedAndUnsigned);
  anon_unknown.dwarf_856b6::AssertInt16Equals(0xcfc7,"-123_45",SignedAndUnsigned);
  anon_unknown.dwarf_856b6::AssertInt16Equals(0x13,"1______9",Both);
  anon_unknown.dwarf_856b6::AssertInt16Equals(0xabcd,"0xa_b_c_d",Both);
  anon_unknown.dwarf_856b6::AssertInt16Equals(0xabcd,"+0xa_b_c_d",SignedAndUnsigned);
  anon_unknown.dwarf_856b6::AssertInt16Equals(0x8433,"-0x7_b_c_d",SignedAndUnsigned);
  return;
}

Assistant:

TEST(ParseInt16, Underscores) {
  AssertInt16Equals(12345, "12_345", Both);
  AssertInt16Equals(12345, "+12_345", SignedAndUnsigned);
  AssertInt16Equals(-12345, "-123_45", SignedAndUnsigned);
  AssertInt16Equals(19, "1______9", Both);
  AssertInt16Equals(0xabcd, "0xa_b_c_d", Both);
  AssertInt16Equals(0xabcd, "+0xa_b_c_d", SignedAndUnsigned);
  AssertInt16Equals(-0x7bcd, "-0x7_b_c_d", SignedAndUnsigned);
}